

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdhistory.cc
# Opt level: O0

bool __thiscall bdMsgHistoryList::canSend(bdMsgHistoryList *this)

{
  bool bVar1;
  time_t tVar2;
  pointer ppVar3;
  size_type sVar4;
  ostream *poVar5;
  time_t now;
  _Rb_tree_iterator<std::pair<const_long,_bdMsgHistoryItem>_> local_28;
  reverse_iterator<std::_Rb_tree_iterator<std::pair<const_long,_bdMsgHistoryItem>_>_> local_20;
  reverse_iterator rit;
  bdMsgHistoryList *this_local;
  
  rit.current._M_node =
       (_Rb_tree_iterator<std::pair<const_long,_bdMsgHistoryItem>_>)
       (_Rb_tree_iterator<std::pair<const_long,_bdMsgHistoryItem>_>)this;
  std::operator<<((ostream *)&std::cerr,"bdMsgHistoryList::canSend()");
  std::reverse_iterator<std::_Rb_tree_iterator<std::pair<const_long,_bdMsgHistoryItem>_>_>::
  reverse_iterator(&local_20);
  std::
  multimap<long,_bdMsgHistoryItem,_std::less<long>,_std::allocator<std::pair<const_long,_bdMsgHistoryItem>_>_>
  ::rbegin((multimap<long,_bdMsgHistoryItem,_std::less<long>,_std::allocator<std::pair<const_long,_bdMsgHistoryItem>_>_>
            *)&local_28);
  local_20.current._M_node =
       (_Rb_tree_iterator<std::pair<const_long,_bdMsgHistoryItem>_>)
       (_Rb_tree_iterator<std::pair<const_long,_bdMsgHistoryItem>_>)local_28._M_node;
  std::
  multimap<long,_bdMsgHistoryItem,_std::less<long>,_std::allocator<std::pair<const_long,_bdMsgHistoryItem>_>_>
  ::rend((multimap<long,_bdMsgHistoryItem,_std::less<long>,_std::allocator<std::pair<const_long,_bdMsgHistoryItem>_>_>
          *)&now);
  bVar1 = std::operator!=(&local_20,
                          (reverse_iterator<std::_Rb_tree_iterator<std::pair<const_long,_bdMsgHistoryItem>_>_>
                           *)&now);
  if (bVar1) {
    tVar2 = time((time_t *)0x0);
    ppVar3 = std::
             reverse_iterator<std::_Rb_tree_iterator<std::pair<const_long,_bdMsgHistoryItem>_>_>::
             operator->(&local_20);
    if (0x3c < tVar2 - ppVar3->first) {
      std::operator<<((ostream *)&std::cerr," OVER RESEND_PERIOD... true");
      std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
      return true;
    }
  }
  sVar4 = std::
          multimap<long,_bdMsgHistoryItem,_std::less<long>,_std::allocator<std::pair<const_long,_bdMsgHistoryItem>_>_>
          ::size(&this->msgHistory);
  bVar1 = (sVar4 & 1) != 0;
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr," false");
    std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr," SIZE: ");
    sVar4 = std::
            multimap<long,_bdMsgHistoryItem,_std::less<long>,_std::allocator<std::pair<const_long,_bdMsgHistoryItem>_>_>
            ::size(&this->msgHistory);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar4);
    std::operator<<(poVar5," % 2 = 0 ... true");
    std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool bdMsgHistoryList::canSend() {
	std::cerr << "bdMsgHistoryList::canSend()";

	std::multimap<time_t, bdMsgHistoryItem>::reverse_iterator rit;

	rit = msgHistory.rbegin();
	if (rit != msgHistory.rend()) {
		time_t now = time(NULL);
		if (now - rit->first > MIN_RESEND_PERIOD) {
			std::cerr << " OVER RESEND_PERIOD... true";
			std::cerr << std::endl;

			return true;
		}
	}

	if (msgHistory.size() % 2 == 0) {
		std::cerr << " SIZE: " << msgHistory.size() << " % 2 = 0 ... true";
		std::cerr << std::endl;

		return true;
	}

	std::cerr << " false";
	std::cerr << std::endl;

	return false;
}